

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_> *
__thiscall
spvtools::opt::Module::GetTypes
          (vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
           *__return_storage_ptr__,Module *this)

{
  Op op;
  int32_t iVar1;
  Instruction *inst;
  Instruction *pIVar2;
  Instruction *pIVar3;
  Instruction *local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar2 = (this->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  pIVar3 = &(this->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  if (pIVar2 != pIVar3) {
    do {
      op = pIVar2->opcode_;
      iVar1 = spvOpcodeGeneratesType(op);
      if ((op == OpTypeForwardPointer) || (iVar1 != 0)) {
        local_30 = pIVar2;
        std::
        vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
        ::emplace_back<spvtools::opt::Instruction_const*>
                  ((vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
                    *)__return_storage_ptr__,&local_30);
      }
      pIVar2 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar2 != pIVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Instruction*> Module::GetTypes() const {
  std::vector<const Instruction*> type_insts;
  for (auto& inst : types_values_) {
    if (IsTypeInst(inst.opcode())) type_insts.push_back(&inst);
  }
  return type_insts;
}